

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImageCubeEmptyTexCase::createTexture
          (TexSubImageCubeEmptyTexCase *this)

{
  ContextWrapper *pCVar1;
  deUint32 format;
  deUint32 type;
  deUint32 dVar2;
  uint uVar3;
  int ndx_1;
  int iVar4;
  long lVar5;
  TextureFormatInfo *minVal;
  int ndx;
  int iVar6;
  Vec4 *maxVal;
  deUint32 tex;
  ContextWrapper *local_d8;
  long local_d0;
  Vec4 *local_c8;
  TextureFormatInfo *local_c0;
  ulong local_b8;
  TextureLevel data;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&(this->super_TextureCubeSpecCase).m_texFormat);
  dVar2 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  pCVar1 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(pCVar1,1,&tex);
  sglr::ContextWrapper::glBindTexture(pCVar1,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf5,1);
  local_d8 = pCVar1;
  for (iVar6 = 0; iVar4 = (this->super_TextureCubeSpecCase).m_numLevels, iVar6 < iVar4;
      iVar6 = iVar6 + 1) {
    iVar4 = (this->super_TextureCubeSpecCase).m_size >> ((byte)iVar6 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
      sglr::ContextWrapper::glTexImage2D
                (local_d8,*(deUint32 *)((long)&s_cubeMapFaces + lVar5),iVar6,this->m_internalFormat,
                 iVar4,iVar4,0,this->m_format,this->m_dataType,(void *)0x0);
    }
  }
  minVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo;
  maxVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax;
  local_c8 = maxVal;
  local_c0 = minVal;
  for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + 1) {
    uVar3 = (this->super_TextureCubeSpecCase).m_size >> ((byte)iVar6 & 0x1f);
    local_b8 = (ulong)uVar3;
    if ((int)uVar3 < 2) {
      local_b8 = 1;
    }
    tcu::TextureLevel::setSize(&data,(int)local_b8,(int)local_b8,1);
    for (local_d0 = 0; local_d0 != 0x18; local_d0 = local_d0 + 4) {
      randomVector<4>((Functional *)&gMin,&rnd,&minVal->valueMin,maxVal);
      randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
      tcu::TextureLevel::getAccess(&local_58,&data);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      pCVar1 = local_d8;
      dVar2 = *(deUint32 *)((long)&s_cubeMapFaces + local_d0);
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&data);
      sglr::ContextWrapper::glTexSubImage2D
                (pCVar1,dVar2,iVar6,0,0,(int)local_b8,(int)local_b8,format,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      minVal = local_c0;
      maxVal = local_c8;
    }
    iVar4 = (this->super_TextureCubeSpecCase).m_numLevels;
    local_d0 = 0x18;
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Specify storage for each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify data using glTexSubImage2D()
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			data.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, 0, 0, levelSize, levelSize, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}